

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove2<(moira::Instr)71,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  undefined8 in_RAX;
  u32 data;
  u32 ea;
  undefined8 local_18;
  
  local_18 = in_RAX;
  bVar1 = readOp<(moira::Mode)2,(moira::Size)1,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_18 + 4),(u32 *)&local_18);
  if (bVar1) {
    (this->reg).sr.n = (bool)((byte)((uint)local_18 >> 0xf) & 1);
    (this->reg).sr.z = (short)local_18 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    bVar1 = writeOp<(moira::Mode)2,(moira::Size)1,64ul>(this,opcode >> 9 & 7,(uint)local_18);
    if (bVar1) {
      (this->reg).sr.n = (bool)((byte)local_18 >> 7);
      (this->reg).sr.z = (byte)local_18 == 0;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
      uVar2 = (this->reg).pc;
      (this->reg).pc0 = uVar2;
      (this->queue).ird = (this->queue).irc;
      uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
      (this->queue).irc = (u16)uVar2;
    }
  }
  return;
}

Assistant:

void
Moira::execMove2(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Word || (M != MODE_DN && M != MODE_AN && M != MODE_IM)) {
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_AI,S,AE_INC_PC> (dst, data)) return;
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch<POLLIPL>();
}